

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall
FileEntryInfo::FileEntryInfo
          (FileEntryInfo *this,IsoWriter *owner,FileEntryInfo *parent,uint8_t objectId,
          FileTypes fileType)

{
  bool bVar1;
  uint8_t *puVar2;
  FileTypes fileType_local;
  uint8_t objectId_local;
  FileEntryInfo *parent_local;
  IsoWriter *owner_local;
  FileEntryInfo *this_local;
  
  std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::vector(&this->m_subDirs);
  std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::vector(&this->m_files);
  this->m_owner = owner;
  this->m_parent = parent;
  this->m_sectorNum = 0;
  this->m_sectorsUsed = 0;
  this->m_objectId = objectId;
  std::__cxx11::string::string((string *)&this->m_name);
  this->m_fileType = fileType;
  std::vector<Extent,_std::allocator<Extent>_>::vector(&this->m_extents);
  this->m_fileSize = 0;
  this->m_sectorBufferSize = 0;
  this->m_subMode = false;
  bVar1 = isFile(this);
  if (bVar1) {
    puVar2 = (uint8_t *)operator_new__(0x800);
    this->m_sectorBuffer = puVar2;
  }
  else {
    this->m_sectorBuffer = (uint8_t *)0x0;
  }
  return;
}

Assistant:

FileEntryInfo::FileEntryInfo(IsoWriter *owner, FileEntryInfo *parent, const uint8_t objectId, const FileTypes fileType)
    : m_owner(owner),
      m_parent(parent),
      m_sectorNum(0),
      m_sectorsUsed(0),
      m_objectId(objectId),
      m_fileType(fileType),
      m_fileSize(0),
      m_sectorBufferSize(0),
      m_subMode(false)
{
    if (isFile())
        m_sectorBuffer = new uint8_t[SECTOR_SIZE];
    else
        m_sectorBuffer = nullptr;
}